

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::semantic_rule<jsonip::grammar::true_p,jsonip::grammar::true_t>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  PositionType state_00;
  PositionType pcVar1;
  long local_38;
  pair<const_char_*,_long> local_30;
  byte local_19;
  PositionType pcStack_18;
  bool result;
  PositionType p;
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state_local;
  
  p = (PositionType)state;
  pcStack_18 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::pos(state);
  local_19 = seq_<jsonip::parser::char_<(char)116>,jsonip::parser::char_<(char)114>,jsonip::parser::char_<(char)117>,jsonip::parser::char_<(char)101>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
             ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                       ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)p);
  state_00 = p;
  if ((bool)local_19) {
    pcVar1 = ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::pos
                       ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)p);
    local_38 = (long)pcVar1 - (long)pcStack_18;
    local_30 = std::make_pair<char_const*&,long>(&stack0xffffffffffffffe8,&local_38);
    grammar::true_p::
    process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
              ((ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *)state_00,&local_30);
  }
  return (bool)(local_19 & 1);
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }